

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_BitUtil.h
# Opt level: O0

uint32_t PDB::BitUtil::FindFirstSetBit<unsigned_int>(uint32_t value)

{
  int iVar1;
  uint uVar2;
  undefined4 local_10;
  uint result;
  uint32_t value_local;
  
  iVar1 = 0;
  for (uVar2 = value; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
    iVar1 = iVar1 + 1;
  }
  local_10 = iVar1 + 1;
  if (value == 0) {
    local_10 = 0;
  }
  if (local_10 != 0) {
    local_10 = local_10 - 1;
  }
  return local_10;
}

Assistant:

PDB_NO_DISCARD inline uint32_t FindFirstSetBit(uint32_t value) PDB_NO_EXCEPT
		{
			PDB_ASSERT(value != 0u, "Invalid value.");

#ifdef _WIN32
			unsigned long result = 0ul;

			_BitScanForward(&result, value);
#else
			unsigned int result = 0u;

			result = static_cast<unsigned int>(__builtin_ffs(static_cast<int>(value)));
			if (result)
				--result;
#endif

			return result;
		}